

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

MOJOSHADER_parseData * copyparsedata(MOJOSHADER_parseData *src,MOJOSHADER_malloc m,void *d)

{
  uint uVar1;
  MOJOSHADER_parseData *__s;
  MOJOSHADER_error *pMVar2;
  size_t sVar3;
  char *pcVar4;
  MOJOSHADER_uniform *pMVar5;
  MOJOSHADER_constant *pMVar6;
  MOJOSHADER_sampler *pMVar7;
  MOJOSHADER_attribute *pMVar8;
  MOJOSHADER_swizzle *pMVar9;
  MOJOSHADER_symbol *pMVar10;
  MOJOSHADER_preshader *pMVar11;
  MOJOSHADER_parseData *retval;
  char *stringcopy;
  uint32 siz;
  int i;
  void *d_local;
  MOJOSHADER_malloc m_local;
  MOJOSHADER_parseData *src_local;
  
  __s = (MOJOSHADER_parseData *)(*m)(0xd0,d);
  memset(__s,0,0xd0);
  __s->malloc = src->malloc;
  __s->free = src->free;
  __s->malloc_data = src->malloc_data;
  uVar1 = src->error_count * 0x18;
  __s->error_count = src->error_count;
  pMVar2 = (MOJOSHADER_error *)(*m)(uVar1,d);
  __s->errors = pMVar2;
  memset(__s->errors,0,(ulong)uVar1);
  for (stringcopy._4_4_ = 0; stringcopy._4_4_ < __s->error_count;
      stringcopy._4_4_ = stringcopy._4_4_ + 1) {
    sVar3 = strlen(src->errors[stringcopy._4_4_].error);
    pcVar4 = (char *)(*m)((int)sVar3 + 1,d);
    strcpy(pcVar4,src->errors[stringcopy._4_4_].error);
    __s->errors[stringcopy._4_4_].error = pcVar4;
    sVar3 = strlen(src->errors[stringcopy._4_4_].filename);
    pcVar4 = (char *)(*m)((int)sVar3 + 1,d);
    strcpy(pcVar4,src->errors[stringcopy._4_4_].filename);
    __s->errors[stringcopy._4_4_].filename = pcVar4;
    __s->errors[stringcopy._4_4_].error_position = src->errors[stringcopy._4_4_].error_position;
  }
  __s->profile = src->profile;
  __s->output_len = src->output_len;
  pcVar4 = (char *)(*m)(src->output_len,d);
  memcpy(pcVar4,src->output,(long)src->output_len);
  __s->output = pcVar4;
  __s->instruction_count = src->instruction_count;
  __s->shader_type = src->shader_type;
  __s->major_ver = src->major_ver;
  __s->minor_ver = src->minor_ver;
  uVar1 = src->uniform_count * 0x18;
  __s->uniform_count = src->uniform_count;
  pMVar5 = (MOJOSHADER_uniform *)(*m)(uVar1,d);
  __s->uniforms = pMVar5;
  memset(__s->uniforms,0,(ulong)uVar1);
  for (stringcopy._4_4_ = 0; stringcopy._4_4_ < __s->uniform_count;
      stringcopy._4_4_ = stringcopy._4_4_ + 1) {
    __s->uniforms[stringcopy._4_4_].type = src->uniforms[stringcopy._4_4_].type;
    __s->uniforms[stringcopy._4_4_].index = src->uniforms[stringcopy._4_4_].index;
    __s->uniforms[stringcopy._4_4_].array_count = src->uniforms[stringcopy._4_4_].array_count;
    __s->uniforms[stringcopy._4_4_].constant = src->uniforms[stringcopy._4_4_].constant;
    sVar3 = strlen(src->uniforms[stringcopy._4_4_].name);
    pcVar4 = (char *)(*m)((int)sVar3 + 1,d);
    strcpy(pcVar4,src->uniforms[stringcopy._4_4_].name);
    __s->uniforms[stringcopy._4_4_].name = pcVar4;
  }
  uVar1 = src->constant_count * 0x18;
  __s->constant_count = src->constant_count;
  pMVar6 = (MOJOSHADER_constant *)(*m)(uVar1,d);
  __s->constants = pMVar6;
  memcpy(__s->constants,src->constants,(ulong)uVar1);
  uVar1 = src->sampler_count * 0x18;
  __s->sampler_count = src->sampler_count;
  pMVar7 = (MOJOSHADER_sampler *)(*m)(uVar1,d);
  __s->samplers = pMVar7;
  memset(__s->samplers,0,(ulong)uVar1);
  for (stringcopy._4_4_ = 0; stringcopy._4_4_ < __s->sampler_count;
      stringcopy._4_4_ = stringcopy._4_4_ + 1) {
    __s->samplers[stringcopy._4_4_].type = src->samplers[stringcopy._4_4_].type;
    __s->samplers[stringcopy._4_4_].index = src->samplers[stringcopy._4_4_].index;
    sVar3 = strlen(src->samplers[stringcopy._4_4_].name);
    pcVar4 = (char *)(*m)((int)sVar3 + 1,d);
    strcpy(pcVar4,src->samplers[stringcopy._4_4_].name);
    __s->samplers[stringcopy._4_4_].name = pcVar4;
    __s->samplers[stringcopy._4_4_].texbem = src->samplers[stringcopy._4_4_].texbem;
  }
  uVar1 = src->attribute_count << 4;
  __s->attribute_count = src->attribute_count;
  pMVar8 = (MOJOSHADER_attribute *)(*m)(uVar1,d);
  __s->attributes = pMVar8;
  memset(__s->attributes,0,(ulong)uVar1);
  for (stringcopy._4_4_ = 0; stringcopy._4_4_ < __s->attribute_count;
      stringcopy._4_4_ = stringcopy._4_4_ + 1) {
    __s->attributes[stringcopy._4_4_].usage = src->attributes[stringcopy._4_4_].usage;
    __s->attributes[stringcopy._4_4_].index = src->attributes[stringcopy._4_4_].index;
    sVar3 = strlen(src->attributes[stringcopy._4_4_].name);
    pcVar4 = (char *)(*m)((int)sVar3 + 1,d);
    strcpy(pcVar4,src->attributes[stringcopy._4_4_].name);
    __s->attributes[stringcopy._4_4_].name = pcVar4;
  }
  uVar1 = src->output_count << 4;
  __s->output_count = src->output_count;
  pMVar8 = (MOJOSHADER_attribute *)(*m)(uVar1,d);
  __s->outputs = pMVar8;
  memset(__s->outputs,0,(ulong)uVar1);
  for (stringcopy._4_4_ = 0; stringcopy._4_4_ < __s->output_count;
      stringcopy._4_4_ = stringcopy._4_4_ + 1) {
    __s->outputs[stringcopy._4_4_].usage = src->outputs[stringcopy._4_4_].usage;
    __s->outputs[stringcopy._4_4_].index = src->outputs[stringcopy._4_4_].index;
    sVar3 = strlen(src->outputs[stringcopy._4_4_].name);
    pcVar4 = (char *)(*m)((int)sVar3 + 1,d);
    strcpy(pcVar4,src->outputs[stringcopy._4_4_].name);
    __s->outputs[stringcopy._4_4_].name = pcVar4;
  }
  uVar1 = src->swizzle_count * 0xc;
  __s->swizzle_count = src->swizzle_count;
  pMVar9 = (MOJOSHADER_swizzle *)(*m)(uVar1,d);
  __s->swizzles = pMVar9;
  memcpy(__s->swizzles,src->swizzles,(ulong)uVar1);
  uVar1 = src->symbol_count * 0x38;
  __s->symbol_count = src->symbol_count;
  pMVar10 = (MOJOSHADER_symbol *)(*m)(uVar1,d);
  __s->symbols = pMVar10;
  memset(__s->symbols,0,(ulong)uVar1);
  for (stringcopy._4_4_ = 0; stringcopy._4_4_ < __s->symbol_count;
      stringcopy._4_4_ = stringcopy._4_4_ + 1) {
    copysymbol(__s->symbols + stringcopy._4_4_,src->symbols + stringcopy._4_4_,m,d);
  }
  if (src->preshader != (MOJOSHADER_preshader *)0x0) {
    pMVar11 = copypreshader(src->preshader,m,d);
    __s->preshader = pMVar11;
  }
  return __s;
}

Assistant:

MOJOSHADER_parseData *copyparsedata(const MOJOSHADER_parseData *src,
                                    MOJOSHADER_malloc m,
                                    void *d)
{
    int i;
    uint32 siz;
    char *stringcopy;
    MOJOSHADER_parseData *retval;

    retval = (MOJOSHADER_parseData *) m(sizeof (MOJOSHADER_parseData), d);
    memset(retval, '\0', sizeof (MOJOSHADER_parseData));

    /* Copy malloc/free */
    retval->malloc = src->malloc;
    retval->free = src->free;
    retval->malloc_data = src->malloc_data;

    // !!! FIXME: Out of memory check!
    #define COPY_STRING(location) \
        siz = strlen(src->location) + 1; \
        stringcopy = (char *) m(siz, d); \
        strcpy(stringcopy, src->location); \
        retval->location = stringcopy; \

    /* Copy errors */
    siz = sizeof (MOJOSHADER_error) * src->error_count;
    retval->error_count = src->error_count;
    retval->errors = (MOJOSHADER_error *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->errors, '\0', siz);
    for (i = 0; i < retval->error_count; i++)
    {
        COPY_STRING(errors[i].error)
        COPY_STRING(errors[i].filename)
        retval->errors[i].error_position = src->errors[i].error_position;
    } // for

    /* Copy profile string constant */
    retval->profile = src->profile;

    /* Copy shader output */
    retval->output_len = src->output_len;
    stringcopy = (char *) m(src->output_len, d);
    memcpy(stringcopy, src->output, src->output_len);
    retval->output = stringcopy;

    /* Copy miscellaneous shader info */
    retval->instruction_count = src->instruction_count;
    retval->shader_type = src->shader_type;
    retval->major_ver = src->major_ver;
    retval->minor_ver = src->minor_ver;

    /* Copy uniforms */
    siz = sizeof (MOJOSHADER_uniform) * src->uniform_count;
    retval->uniform_count = src->uniform_count;
    retval->uniforms = (MOJOSHADER_uniform *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->uniforms, '\0', siz);
    for (i = 0; i < retval->uniform_count; i++)
    {
        retval->uniforms[i].type = src->uniforms[i].type;
        retval->uniforms[i].index = src->uniforms[i].index;
        retval->uniforms[i].array_count = src->uniforms[i].array_count;
        retval->uniforms[i].constant = src->uniforms[i].constant;
        COPY_STRING(uniforms[i].name)
    } // for

    /* Copy constants */
    siz = sizeof (MOJOSHADER_constant) * src->constant_count;
    retval->constant_count = src->constant_count;
    retval->constants = (MOJOSHADER_constant *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memcpy(retval->constants, src->constants, siz);

    /* Copy samplers */
    siz = sizeof (MOJOSHADER_sampler) * src->sampler_count;
    retval->sampler_count = src->sampler_count;
    retval->samplers = (MOJOSHADER_sampler *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->samplers, '\0', siz);
    for (i = 0; i < retval->sampler_count; i++)
    {
        retval->samplers[i].type = src->samplers[i].type;
        retval->samplers[i].index = src->samplers[i].index;
        COPY_STRING(samplers[i].name)
        retval->samplers[i].texbem = src->samplers[i].texbem;
    } // for

    /* Copy attributes */
    siz = sizeof (MOJOSHADER_attribute) * src->attribute_count;
    retval->attribute_count = src->attribute_count;
    retval->attributes = (MOJOSHADER_attribute *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->attributes, '\0', siz);
    for (i = 0; i < retval->attribute_count; i++)
    {
        retval->attributes[i].usage = src->attributes[i].usage;
        retval->attributes[i].index = src->attributes[i].index;
        COPY_STRING(attributes[i].name)
    } // for

    /* Copy outputs */
    siz = sizeof (MOJOSHADER_attribute) * src->output_count;
    retval->output_count = src->output_count;
    retval->outputs = (MOJOSHADER_attribute *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->outputs, '\0', siz);
    for (i = 0; i < retval->output_count; i++)
    {
        retval->outputs[i].usage = src->outputs[i].usage;
        retval->outputs[i].index = src->outputs[i].index;
        COPY_STRING(outputs[i].name)
    } // for

    #undef COPY_STRING

    /* Copy swizzles */
    siz = sizeof (MOJOSHADER_swizzle) * src->swizzle_count;
    retval->swizzle_count = src->swizzle_count;
    retval->swizzles = (MOJOSHADER_swizzle *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memcpy(retval->swizzles, src->swizzles, siz);

    /* Copy symbols */
    siz = sizeof (MOJOSHADER_symbol) * src->symbol_count;
    retval->symbol_count = src->symbol_count;
    retval->symbols = (MOJOSHADER_symbol *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->symbols, '\0', siz);
    for (i = 0; i < retval->symbol_count; i++)
        copysymbol(&retval->symbols[i], &src->symbols[i], m, d);

    /* Copy preshader */
    if (src->preshader != NULL)
        retval->preshader = copypreshader(src->preshader, m, d);

    return retval;
}